

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O2

void ma_momentum_derive(ga_twist *xd,ma_momentum *p,ma_wrench *r)

{
  frame *pfVar1;
  frame *pfVar2;
  point *ppVar3;
  uint __line;
  char *__assertion;
  
  if (xd == (ga_twist *)0x0) {
    __assertion = "xd";
    __line = 0x2e;
  }
  else if (p == (ma_momentum *)0x0) {
    __assertion = "p";
    __line = 0x2f;
  }
  else if (r == (ma_wrench *)0x0) {
    __assertion = "r";
    __line = 0x30;
  }
  else {
    pfVar1 = xd->frame;
    if (pfVar1 == (frame *)0x0) {
      __assertion = "xd->frame";
      __line = 0x31;
    }
    else {
      pfVar2 = p->frame;
      if (pfVar2 == (frame *)0x0) {
        __assertion = "p->frame";
        __line = 0x32;
      }
      else {
        ppVar3 = xd->point;
        if (pfVar1->origin == ppVar3) {
          if (pfVar2->origin == p->point) {
            if (xd->target_body == p->body) {
              if (pfVar1->origin == pfVar2->origin) {
                if (pfVar1 == pfVar2) {
                  r->body = xd->target_body;
                  r->point = ppVar3;
                  r->frame = pfVar1;
                  return;
                }
                __assertion = "xd->frame == p->frame";
                __line = 0x37;
              }
              else {
                __assertion = "xd->point == p->point";
                __line = 0x36;
              }
            }
            else {
              __assertion = "xd->target_body == p->body";
              __line = 0x35;
            }
          }
          else {
            __assertion = "p->frame->origin == p->point";
            __line = 0x34;
          }
        }
        else {
          __assertion = "xd->frame->origin == xd->point";
          __line = 0x33;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,__line,
                "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
               );
}

Assistant:

void ma_momentum_derive(
        const struct ga_twist *xd,
        const struct ma_momentum *p,
        struct ma_wrench *r)
{
    assert(xd);
    assert(p);
    assert(r);
    assert(xd->frame);
    assert(p->frame);
    assert(xd->frame->origin == xd->point);     // screw twist
    assert(p->frame->origin == p->point);       // wrench
    assert(xd->target_body == p->body);
    assert(xd->point == p->point);
    assert(xd->frame == p->frame);

    r->body = xd->target_body;
    r->point = xd->point;
    r->frame = xd->frame;
}